

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

void __thiscall
Time::run(Time *this,unsigned_long_long events,StochasticEventGenerator *eventSource,
         unsigned_long_long maxSteps,ostream *log,bool init)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppTVar4;
  reference ppEVar5;
  ulong uVar6;
  unsigned_long_long currentPercentage;
  int i_3;
  int i_2;
  unsigned_long_long s;
  unsigned_long_long e;
  unsigned_long_long lastPercentage;
  uint local_68;
  uint i_1;
  uint i;
  string local_58;
  byte local_31;
  ostream *poStack_30;
  bool init_local;
  ostream *log_local;
  unsigned_long_long maxSteps_local;
  StochasticEventGenerator *eventSource_local;
  unsigned_long_long events_local;
  Time *this_local;
  
  local_31 = init;
  poStack_30 = log;
  log_local = (ostream *)maxSteps;
  maxSteps_local = (unsigned_long_long)eventSource;
  eventSource_local = (StochasticEventGenerator *)events;
  events_local = (unsigned_long_long)this;
  poVar2 = std::operator<<(log,"\rstarting simulation: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulonglong)eventSource_local);
  poVar2 = std::operator<<(poVar2," events from ");
  Parametric::getName_abi_cxx11_(&local_58,(Parametric *)maxSteps_local);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  poVar2 = std::operator<<(poVar2,".         \t");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_58);
  if ((local_31 & 1) != 0) {
    for (local_68 = 0;
        sVar3 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::size
                          (&this->timeObjects), local_68 < sVar3; local_68 = local_68 + 1) {
      ppTVar4 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                          (&this->timeObjects,(ulong)local_68);
      (*(*ppTVar4)->_vptr_TimeDependent[4])();
    }
    for (lastPercentage._4_4_ = 0;
        sVar3 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::size(&this->timeEstimators),
        lastPercentage._4_4_ < sVar3; lastPercentage._4_4_ = lastPercentage._4_4_ + 1) {
      ppEVar5 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::operator[]
                          (&this->timeEstimators,(ulong)lastPercentage._4_4_);
      (*((*ppEVar5)->super_Parametric)._vptr_Parametric[4])();
    }
  }
  e = 0;
  s = 0;
  _i_3 = (ostream *)0x0;
  while( true ) {
    if (eventSource_local <= s || log_local <= _i_3) {
      return;
    }
    bVar1 = step(this);
    if (!bVar1) break;
    sVar3 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::size(&this->timeEstimators);
    currentPercentage._4_4_ = (int)sVar3;
    while (currentPercentage._4_4_ = currentPercentage._4_4_ + -1, currentPercentage._4_4_ != -1) {
      ppEVar5 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::operator[]
                          (&this->timeEstimators,(long)currentPercentage._4_4_);
      (*((*ppEVar5)->super_Parametric)._vptr_Parametric[5])();
    }
    sVar3 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::size(&this->timeObjects)
    ;
    currentPercentage._0_4_ = (int)sVar3;
    while (currentPercentage._0_4_ = (int)currentPercentage + -1, (int)currentPercentage != -1) {
      ppTVar4 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                          (&this->timeObjects,(long)(int)currentPercentage);
      (*(*ppTVar4)->_vptr_TimeDependent[2])();
    }
    uVar6 = (**(code **)(*(long *)maxSteps_local + 0x78))();
    if ((uVar6 & 1) != 0) {
      s = s + 1;
      _i_3 = (ostream *)0x0;
    }
    uVar6 = (s * 100) / (ulong)eventSource_local;
    if (uVar6 != e) {
      poVar2 = std::operator<<(poStack_30,"\rrunning simulation: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar6);
      poVar2 = std::operator<<(poVar2,"%         \t");
      std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
      e = uVar6;
    }
    _i_3 = (ostream *)((long)&_i_3->_vptr_basic_ostream + 1);
  }
  poVar2 = std::operator<<(poStack_30,
                           "\rerror running simulation: some circular dependencies couldn\'t be resolved"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Time::run(unsigned long long events, StochasticEventGenerator *eventSource, unsigned long long maxSteps, ostream &log, bool init)
{
	// starting note
	log << "\rstarting simulation: " 
			<< events << " events from "
			<< eventSource->getName()
			<< ".         \t"
			<< endl;
	
	// initialise time objects
	if (init) {
		for (uint i=0; i<timeObjects.size(); ++i)
			timeObjects[i]->init();
		for (uint i=0; i<timeEstimators.size(); ++i)
			timeEstimators[i]->init();
	}
	
	unsigned long long lastPercentage = 0;
	for (unsigned long long e=0, s=0; e<events && s<maxSteps; ++s) {

		// perform time step, throw error if unsuccessful
		if (!step()) {
			log << "\rerror running simulation: some circular dependencies couldn't be resolved" << endl;
			return;
		}
		
		// collect values in all estimators
		for (int i=timeEstimators.size()-1; i+1; --i)
			timeEstimators[i]->collect();

		// advance all objects in time
		for (int i=timeObjects.size()-1; i+1; --i)
			timeObjects[i]->proceedToNextState();

		// count events
		if (eventSource->hasEvent()) {
			++e;
			s = 0;
		}
		
		// note to user
		unsigned long long currentPercentage = ( e * 100ULL ) / events;
		if (currentPercentage != lastPercentage) {
			log << "\rrunning simulation: " 
					<< currentPercentage
					<< "%         \t"
					<< flush;
			lastPercentage = currentPercentage;
		}
	}
}